

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer
          (DiscardGeometry *this,GLuint primitive_case)

{
  long *plVar1;
  deUint32 err;
  long lVar2;
  float *pfVar3;
  undefined4 in_register_00000034;
  allocator_type local_29;
  vector<float,_std::allocator<float>_> pixels;
  
  plVar1 = *(long **)(*(long *)(&(this->super_CaptureGeometryInterleaved).field_0x78 +
                               (long)(this->super_CaptureGeometryInterleaved).
                                     _vptr_CaptureGeometryInterleaved[-3]) + 8);
  lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,CONCAT44(in_register_00000034,primitive_case));
  std::vector<float,_std::allocator<float>_>::vector(&pixels,4,&local_29);
  (**(code **)(lVar2 + 0x1220))
            (0,0,2,2,0x1903,0x1406,
             pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1081);
  do {
    pfVar3 = pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar3 == pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
    pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar3 + 1;
  } while (ABS(*pfVar3) <= 0.0625);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixels.super__Vector_base<float,_std::allocator<float>_>);
  return pfVar3 == pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
}

Assistant:

bool gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer(glw::GLuint primitive_case UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}